

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

LOs __thiscall Omega_h::compound_maps(Omega_h *this,LOs *a2b,LOs *b2c)

{
  char *file;
  void *extraout_RDX;
  LOs LVar1;
  Write<int> local_180;
  undefined1 local_170 [8];
  type f;
  string local_138 [32];
  undefined1 local_118 [8];
  Write<int> a2c;
  __cxx11 local_100 [4];
  LO na;
  allocator local_c9;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [39];
  ScopedTimer local_61;
  LOs *pLStack_60;
  ScopedTimer omega_h_scoped_function_timer;
  LOs *b2c_local;
  LOs *a2b_local;
  ulong local_20;
  ulong local_10;
  
  pLStack_60 = b2c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_c9);
  std::operator+(local_a8,(char *)local_c8);
  std::__cxx11::to_string(local_100,0x94);
  std::operator+(local_88,local_a8);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_61,"compound_maps",file);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  a2c.shared_alloc_.direct_ptr._4_4_ = (LO)(local_10 >> 2);
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_138,"",(allocator *)((long)&f.a2c.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_118,(LO)(local_20 >> 2),(string *)local_138);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f.a2c.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)local_170,a2b);
  Read<int>::Read((Read<int> *)&f.a2b.write_.shared_alloc_.direct_ptr,b2c);
  Write<int>::Write((Write<int> *)&f.b2c.write_.shared_alloc_.direct_ptr,(Write<int> *)local_118);
  parallel_for<Omega_h::compound_maps(Omega_h::Read<int>,Omega_h::Read<int>)::__0>
            (a2c.shared_alloc_.direct_ptr._4_4_,(type *)local_170);
  Write<int>::Write(&local_180,(Write<int> *)local_118);
  Read<int>::Read((Read<int> *)this,&local_180);
  Write<int>::~Write(&local_180);
  compound_maps(Omega_h::Read<int>,Omega_h::Read<int>)::$_0::~__0((__0 *)local_170);
  Write<int>::~Write((Write<int> *)local_118);
  ScopedTimer::~ScopedTimer(&local_61);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs compound_maps(LOs a2b, LOs b2c) {
  OMEGA_H_TIME_FUNCTION;
  LO na = a2b.size();
  Write<LO> a2c(a2b.size());
  auto f = OMEGA_H_LAMBDA(LO a) {
    LO b = a2b[a];
    LO c = b2c[b];
    a2c[a] = c;
  };
  parallel_for(na, std::move(f));
  return a2c;
}